

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

Statement *
slang::ast::ProceduralDeassignStatement::fromSyntax
          (Compilation *compilation,ProceduralDeassignStatementSyntax *syntax,ASTContext *context)

{
  short sVar1;
  SourceRange sourceRange;
  bool bVar2;
  Compilation *compilation_00;
  Expression *pEVar3;
  Statement *in_RDX;
  long in_RSI;
  SourceRange *in_RDI;
  SourceRange SVar4;
  ProceduralDeassignStatement *result;
  bool isRelease;
  Expression *lvalue;
  ASTContext ctx;
  ASTFlags in_stack_ffffffffffffff30;
  ASTContext *in_stack_ffffffffffffff38;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff40;
  ASTContext *in_stack_ffffffffffffff48;
  BumpAllocator *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined8 in_stack_ffffffffffffff60;
  DiagCode code;
  ASTContext *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff78 [16];
  unkbyte9 Var5;
  bitmask<slang::ast::AssignFlags> local_69;
  Expression *local_68;
  underlying_type local_60;
  long local_18;
  SourceRange *local_10;
  Expression *local_8;
  SyntaxNode *this;
  
  code = SUB84((ulong)in_stack_ffffffffffffff60 >> 0x20,0);
  Var5 = in_stack_ffffffffffffff78._8_9_;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_60 = (underlying_type)
             ast::operator|((ASTFlags)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  ASTContext::resetFlags(in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
  compilation_00 =
       (Compilation *)
       not_null<slang::syntax::ExpressionSyntax_*>::operator*
                 ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa5a8f6);
  memset(&local_69,0,1);
  bitmask<slang::ast::AssignFlags>::bitmask(&local_69);
  this = (SyntaxNode *)((unkuint9)Var5 >> 8);
  pEVar3 = Expression::bindLValue
                     ((ExpressionSyntax *)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff68,
                      (bitmask<slang::ast::AssignFlags>)(underlying_type)Var5);
  sVar1 = *(short *)(local_18 + 0x58);
  local_68 = pEVar3;
  SVar4 = slang::syntax::SyntaxNode::sourceRange(this);
  Var5 = SVar4._7_9_;
  pEVar3 = (Expression *)
           BumpAllocator::
           emplace<slang::ast::ProceduralDeassignStatement,slang::ast::Expression_const&,bool&,slang::SourceRange>
                     (in_stack_ffffffffffffff50,(Expression *)in_stack_ffffffffffffff48,
                      (bool *)pEVar3,local_10);
  bVar2 = Expression::bad((Expression *)compilation_00);
  if (bVar2) {
    local_8 = (Expression *)Statement::badStmt(compilation_00,in_RDX);
  }
  else if (sVar1 == 0x103) {
    bVar2 = isValidForceLVal(pEVar3,(ASTContext *)((unkuint9)Var5 >> 8),SUB91(Var5,0));
    local_8 = pEVar3;
    if (!bVar2) {
      sourceRange.endLoc._0_4_ = in_stack_ffffffffffffff58;
      sourceRange.startLoc = (SourceLocation)in_stack_ffffffffffffff50;
      sourceRange.endLoc._4_4_ = in_stack_ffffffffffffff5c;
      ASTContext::addDiag(in_stack_ffffffffffffff48,SUB84((local_68->sourceRange).startLoc,4),
                          sourceRange);
      local_8 = (Expression *)Statement::badStmt(compilation_00,in_RDX);
    }
  }
  else {
    bVar2 = isValidAssignLVal((Expression *)in_stack_ffffffffffffff68);
    local_8 = pEVar3;
    if (!bVar2) {
      SVar4.endLoc._0_4_ = in_stack_ffffffffffffff58;
      SVar4.startLoc = (local_68->sourceRange).endLoc;
      SVar4.endLoc._4_4_ = 0x40008;
      ASTContext::addDiag((ASTContext *)(local_68->sourceRange).startLoc,code,SVar4);
      local_8 = (Expression *)Statement::badStmt(compilation_00,in_RDX);
    }
  }
  return (Statement *)local_8;
}

Assistant:

Statement& ProceduralDeassignStatement::fromSyntax(Compilation& compilation,
                                                   const ProceduralDeassignStatementSyntax& syntax,
                                                   const ASTContext& context) {
    auto ctx = context.resetFlags(ASTFlags::NonProcedural | ASTFlags::ProceduralForceRelease);
    auto& lvalue = Expression::bindLValue(*syntax.variable, ctx);

    bool isRelease = syntax.keyword.kind == TokenKind::ReleaseKeyword;
    auto result = compilation.emplace<ProceduralDeassignStatement>(lvalue, isRelease,
                                                                   syntax.sourceRange());
    if (lvalue.bad())
        return badStmt(compilation, result);

    if (isRelease) {
        if (!isValidForceLVal(lvalue, ctx, false)) {
            ctx.addDiag(diag::BadProceduralForce, lvalue.sourceRange);
            return badStmt(compilation, result);
        }
    }
    else {
        if (!isValidAssignLVal(lvalue)) {
            ctx.addDiag(diag::BadProceduralAssign, lvalue.sourceRange);
            return badStmt(compilation, result);
        }
    }

    return *result;
}